

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall trieste::NodeDef::push_back_ephemeral(NodeDef *this,NodeRange range)

{
  bool bVar1;
  reference psVar2;
  shared_ptr<trieste::NodeDef> local_38;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  local_28;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  it;
  NodeDef *this_local;
  NodeRange range_local;
  
  range_local.first = range.second._M_current;
  local_28 = range.first._M_current;
  it._M_current = (shared_ptr<trieste::NodeDef> *)this;
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                      (&local_28,&range_local.first);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
             ::operator*(&local_28);
    std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_38,psVar2);
    push_back_ephemeral(this,&local_38);
    std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_38);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void push_back_ephemeral(NodeRange range)
    {
      for (auto it = range.first; it != range.second; ++it)
        push_back_ephemeral(*it);
    }